

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_heap_sift_down(int **dst,size_t start,size_t end)

{
  int *piVar1;
  int *_sort_swap_temp;
  size_t child;
  size_t root;
  size_t end_local;
  size_t start_local;
  int **dst_local;
  
  root = start;
  while( true ) {
    if (end <= root * 2 && root * 2 - end != 0) {
      return;
    }
    child = root * 2;
    if ((child < end) && (*dst[root * 2] - *dst[root * 2 + 1] < 0)) {
      child = child + 1;
    }
    if (-1 < *dst[root] - *dst[child]) break;
    piVar1 = dst[root];
    dst[root] = dst[child];
    dst[child] = piVar1;
    root = child;
  }
  return;
}

Assistant:

static __inline void HEAP_SIFT_DOWN(SORT_TYPE *dst, const size_t start,
                                    const size_t end) {
  size_t root = start;

  while ((root << 1) <= end) {
    size_t child = root << 1;

    if ((child < end) && (SORT_CMP(dst[child], dst[child + 1]) < 0)) {
      child++;
    }

    if (SORT_CMP(dst[root], dst[child]) < 0) {
      SORT_SWAP(dst[root], dst[child]);
      root = child;
    } else {
      return;
    }
  }
}